

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

char * Abc_SopFromTruthBin(char *pTruth)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  Vec_Int_t *p;
  Vec_Int_t *vMints;
  int local_40;
  int b;
  int i;
  int Mint;
  int Length;
  int Digit;
  int nVars;
  int nTruthSize;
  char *pCube;
  char *pSopCover;
  char *pTruth_local;
  
  sVar5 = strlen(pTruth);
  uVar4 = (uint)sVar5;
  uVar1 = Abc_Base2Log(uVar4);
  if (uVar4 == 1 << ((byte)uVar1 & 0x1f)) {
    p = Vec_IntAlloc(100);
    for (local_40 = 0; local_40 < (int)uVar4; local_40 = local_40 + 1) {
      if ((pTruth[local_40] < '0') || ('1' < pTruth[local_40])) {
        Vec_IntFree(p);
        printf("String %s does not look like a binary representation of the truth table.\n",pTruth);
        return (char *)0x0;
      }
      if (pTruth[local_40] == '1') {
        Vec_IntPush(p,(uVar4 - 1) - local_40);
      }
    }
    iVar2 = Vec_IntSize(p);
    if ((iVar2 == 0) || (uVar3 = Vec_IntSize(p), uVar3 == uVar4)) {
      Vec_IntFree(p);
      printf("Cannot create constant function.\n");
      pTruth_local = (char *)0x0;
    }
    else {
      iVar2 = Vec_IntSize(p);
      iVar2 = iVar2 * (uVar1 + 3);
      pTruth_local = (char *)malloc((long)(iVar2 + 1));
      pTruth_local[iVar2] = '\0';
      for (local_40 = 0; iVar2 = Vec_IntSize(p), local_40 < iVar2; local_40 = local_40 + 1) {
        uVar4 = Vec_IntEntry(p,local_40);
        iVar2 = local_40 * (uVar1 + 3);
        for (vMints._4_4_ = 0; vMints._4_4_ < (int)uVar1; vMints._4_4_ = vMints._4_4_ + 1) {
          if ((uVar4 & 1 << (((byte)uVar1 - 1) - (char)vMints._4_4_ & 0x1f)) == 0) {
            pTruth_local[(long)vMints._4_4_ + (long)iVar2] = '0';
          }
          else {
            pTruth_local[(long)vMints._4_4_ + (long)iVar2] = '1';
          }
        }
        pTruth_local[(long)(int)uVar1 + (long)iVar2] = ' ';
        pTruth_local[(long)(int)(uVar1 + 1) + (long)iVar2] = '1';
        pTruth_local[(long)(int)(uVar1 + 2) + (long)iVar2] = '\n';
      }
      Vec_IntFree(p);
    }
  }
  else {
    printf("String %s does not look like a truth table of a %d-variable function.\n",pTruth,
           (ulong)uVar1);
    pTruth_local = (char *)0x0;
  }
  return pTruth_local;
}

Assistant:

char * Abc_SopFromTruthBin( char * pTruth )
{
    char * pSopCover, * pCube;
    int nTruthSize, nVars, Digit, Length, Mint, i, b;
    Vec_Int_t * vMints;

    // get the number of variables
    nTruthSize = strlen(pTruth);
    nVars = Abc_Base2Log( nTruthSize );
    if ( nTruthSize != (1 << (nVars)) )
    {
        printf( "String %s does not look like a truth table of a %d-variable function.\n", pTruth, nVars );
        return NULL;
    }

    // collect the on-set minterms
    vMints = Vec_IntAlloc( 100 );
    for ( i = 0; i < nTruthSize; i++ )
    {
        if ( pTruth[i] >= '0' && pTruth[i] <= '1' )
            Digit = pTruth[i] - '0';
        else
        {
            Vec_IntFree( vMints );
            printf( "String %s does not look like a binary representation of the truth table.\n", pTruth );
            return NULL;
        }
        if ( Digit == 1 )
            Vec_IntPush( vMints, nTruthSize - 1 - i );
    }
    if ( Vec_IntSize( vMints ) == 0 || Vec_IntSize( vMints ) == nTruthSize )
    {
        Vec_IntFree( vMints );
        printf( "Cannot create constant function.\n" );
        return NULL;
    }

    // create the SOP representation of the minterms
    Length = Vec_IntSize(vMints) * (nVars + 3);
    pSopCover = ABC_ALLOC( char, Length + 1 );
    pSopCover[Length] = 0;
    Vec_IntForEachEntry( vMints, Mint, i )
    {
        pCube = pSopCover + i * (nVars + 3);
        for ( b = 0; b < nVars; b++ )
            if ( Mint & (1 << (nVars-1-b)) )
//            if ( Mint & (1 << b) )
                pCube[b] = '1';
            else
                pCube[b] = '0';
        pCube[nVars + 0] = ' ';
        pCube[nVars + 1] = '1';
        pCube[nVars + 2] = '\n';
    }
    Vec_IntFree( vMints );
    return pSopCover;
}